

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall
QMdiAreaPrivate::emitWindowActivated(QMdiAreaPrivate *this,QMdiSubWindow *activeWindow)

{
  int *piVar1;
  QWidget *this_00;
  long lVar2;
  QPointer<QMdiSubWindow> *pQVar3;
  Data *pDVar4;
  bool bVar5;
  int iVar6;
  QObject *pQVar7;
  Data *pDVar8;
  long lVar9;
  long lVar10;
  int index;
  QMdiSubWindow *pQVar11;
  long lVar12;
  long in_FS_OFFSET;
  QObject *local_50;
  void *local_48;
  QObject **local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  pDVar8 = (this->active).wp.d;
  if ((pDVar8 == (Data *)0x0) || (*(int *)(pDVar8 + 4) == 0)) {
    pQVar7 = (QObject *)0x0;
  }
  else {
    pQVar7 = (this->active).wp.value;
  }
  if (pQVar7 != (QObject *)activeWindow) {
    pDVar8 = (this->aboutToBecomeActive).wp.d;
    if (((pDVar8 == (Data *)0x0) || (*(int *)(pDVar8 + 4) == 0)) ||
       ((this->aboutToBecomeActive).wp.value == (QObject *)0x0)) {
      _q_deactivateAllWindows(this,activeWindow);
    }
    if (this->showActiveWindowMaximized == true) {
      bVar5 = QWidget::isMaximized(&activeWindow->super_QWidget);
      if (!bVar5) {
        QWidget::showMaximized(&activeWindow->super_QWidget);
      }
      this->showActiveWindowMaximized = false;
    }
    lVar2 = (this->childWindows).d.size;
    if (lVar2 == 0) {
LAB_0043f26c:
      index = -1;
    }
    else {
      pQVar3 = (this->childWindows).d.ptr;
      lVar10 = 0;
      index = -1;
      do {
        if (lVar2 << 4 == lVar10) goto LAB_0043f26c;
        lVar12 = *(long *)((long)&(pQVar3->wp).d + lVar10);
        if ((lVar12 == 0) || (*(int *)(lVar12 + 4) == 0)) {
          pQVar11 = (QMdiSubWindow *)0x0;
        }
        else {
          pQVar11 = *(QMdiSubWindow **)((long)&(pQVar3->wp).value + lVar10);
        }
        lVar10 = lVar10 + 0x10;
        index = index + 1;
      } while (pQVar11 != activeWindow);
    }
    lVar2 = (this->indicesToActivatedChildren).d.size;
    lVar10 = -1;
    if (lVar2 != 0) {
      lVar9 = -0x100000000;
      lVar12 = 0;
      do {
        if (lVar2 << 2 == lVar12) goto LAB_0043f2c9;
        lVar9 = lVar9 + 0x100000000;
        piVar1 = (int *)((long)(this->indicesToActivatedChildren).d.ptr + lVar12);
        lVar12 = lVar12 + 4;
      } while (*piVar1 != index);
      lVar10 = lVar9 >> 0x20;
    }
LAB_0043f2c9:
    QList<int>::move(&this->indicesToActivatedChildren,lVar10,0);
    internalRaise(this,activeWindow);
    if (this->updatesDisabledByUs == true) {
      QWidget::setUpdatesEnabled(this_00,true);
      this->updatesDisabledByUs = false;
    }
    if (activeWindow == (QMdiSubWindow *)0x0) {
      pDVar8 = (Data *)0x0;
    }
    else {
      pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)activeWindow);
    }
    pDVar4 = (this->active).wp.d;
    (this->active).wp.d = pDVar8;
    (this->active).wp.value = (QObject *)activeWindow;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar4 = *(int *)pDVar4 + -1;
      UNLOCK();
      if (*(int *)pDVar4 == 0) {
        operator_delete(pDVar4);
      }
    }
    pDVar8 = (this->aboutToBecomeActive).wp.d;
    (this->aboutToBecomeActive).wp.d = (Data *)0x0;
    (this->aboutToBecomeActive).wp.value = (QObject *)0x0;
    if (pDVar8 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar8 = *(int *)pDVar8 + -1;
      UNLOCK();
      if (*(int *)pDVar8 == 0) {
        operator_delete(pDVar8);
      }
    }
    if ((this->tabBar != (QMdiAreaTabBar *)0x0) &&
       (iVar6 = QTabBar::currentIndex(&this->tabBar->super_QTabBar), iVar6 != index)) {
      QTabBar::setCurrentIndex(&this->tabBar->super_QTabBar,index);
    }
    bVar5 = QWidget::isMaximized((QWidget *)(this->active).wp.value);
    if ((bVar5) &&
       (((this->super_QAbstractScrollAreaPrivate).hbarpolicy != ScrollBarAlwaysOff ||
        ((this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOff)))) {
      updateScrollBars(this);
    }
    pDVar8 = (this->active).wp.d;
    if ((pDVar8 == (Data *)0x0) || (*(int *)(pDVar8 + 4) == 0)) {
      local_50 = (QObject *)0x0;
    }
    else {
      local_50 = (this->active).wp.value;
    }
    local_40 = &local_50;
    local_48 = (void *)0x0;
    QMetaObject::activate(&this_00->super_QObject,&QMdiArea::staticMetaObject,0,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::emitWindowActivated(QMdiSubWindow *activeWindow)
{
    Q_Q(QMdiArea);
    Q_ASSERT(activeWindow);
    if (activeWindow == active)
        return;
    Q_ASSERT(activeWindow->d_func()->isActive);

    if (!aboutToBecomeActive)
        _q_deactivateAllWindows(activeWindow);
    Q_ASSERT(aboutToBecomeActive);

    // This is true only if 'DontMaximizeSubWindowOnActivation' is disabled
    // and the previous active window was maximized.
    if (showActiveWindowMaximized) {
        if (!activeWindow->isMaximized())
            activeWindow->showMaximized();
        showActiveWindowMaximized = false;
    }

    // Put in front to update activation order.
    const int indexToActiveWindow = childWindows.indexOf(activeWindow);
    Q_ASSERT(indexToActiveWindow != -1);
    const int index = indicesToActivatedChildren.indexOf(indexToActiveWindow);
    Q_ASSERT(index != -1);
    indicesToActivatedChildren.move(index, 0);
    internalRaise(activeWindow);

    if (updatesDisabledByUs) {
        q->setUpdatesEnabled(true);
        updatesDisabledByUs = false;
    }

    Q_ASSERT(aboutToBecomeActive == activeWindow);
    active = activeWindow;
    aboutToBecomeActive = nullptr;
    Q_ASSERT(active->d_func()->isActive);

#if QT_CONFIG(tabbar)
    if (tabBar && tabBar->currentIndex() != indexToActiveWindow)
        tabBar->setCurrentIndex(indexToActiveWindow);
#endif

    if (active->isMaximized() && scrollBarsEnabled())
        updateScrollBars();

    emit q->subWindowActivated(active);
}